

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::generateDSAParameters
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,
          CK_OBJECT_HANDLE_PTR phKey,CK_BBOOL isOnToken,CK_BBOOL isPrivate)

{
  void *pvVar1;
  DSAParameters *this_00;
  Token *this_01;
  char cVar2;
  int iVar3;
  Session *this_02;
  long lVar4;
  CryptoFactory *pCVar5;
  undefined4 extraout_var;
  long *plVar6;
  ByteString *pBVar7;
  unsigned_long *puVar8;
  CK_ULONG CVar9;
  CK_ULONG CVar10;
  char *format;
  CK_ULONG i;
  ulong uVar11;
  bool bVar12;
  CK_RV CStack_4a0;
  CK_BBOOL isOnToken_local;
  CK_OBJECT_HANDLE_PTR local_488;
  AsymmetricParameters *p;
  DSAParameters *local_478;
  long *local_470;
  Token *local_468;
  CK_KEY_TYPE keyType;
  CK_OBJECT_CLASS objClass;
  ByteString generator;
  ByteString subprime;
  ByteString prime;
  OSAttribute local_3d8;
  CK_ATTRIBUTE paramsAttribs [32];
  
  *phKey = 0;
  isOnToken_local = isOnToken;
  this_02 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_02 == (Session *)0x0) {
    return 0xb3;
  }
  local_468 = Session::getToken(this_02);
  if (local_468 == (Token *)0x0) {
    return 5;
  }
  puVar8 = &pTemplate->ulValueLen;
  lVar4 = 0;
  uVar11 = 0;
  CVar10 = ulCount;
  while (bVar12 = CVar10 != 0, CVar10 = CVar10 - 1, bVar12) {
    if (((_CK_ATTRIBUTE *)(puVar8 + -2))->type == 0x134) {
      if (*puVar8 != 8) {
        format = "CKA_SUB_PRIME_BITS does not have the size of CK_ULONG";
        iVar3 = 0x2306;
LAB_00138b26:
        softHSMLog(6,"generateDSAParameters",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,iVar3,format);
        return 0x13;
      }
      lVar4 = *(long *)puVar8[-1];
    }
    else if (((_CK_ATTRIBUTE *)(puVar8 + -2))->type == 0x133) {
      if (*puVar8 != 8) {
        format = "CKA_PRIME_BITS does not have the size of CK_ULONG";
        iVar3 = 0x22fe;
        goto LAB_00138b26;
      }
      uVar11 = *(ulong *)puVar8[-1];
    }
    puVar8 = puVar8 + 3;
  }
  if (uVar11 == 0) {
    softHSMLog(6,"generateDSAParameters",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x2313,"Missing CKA_PRIME_BITS in pTemplate");
    return 0xd0;
  }
  local_488 = phKey;
  if ((lVar4 != 0) &&
     (((0x7ff < uVar11 && (lVar4 != 0x100)) || ((uVar11 < 0x800 && (lVar4 != 0xa0)))))) {
    softHSMLog(6,"generateDSAParameters",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x231b,"CKA_SUB_PRIME_BITS is ignored");
  }
  p = (AsymmetricParameters *)0x0;
  pCVar5 = CryptoFactory::i();
  iVar3 = (*pCVar5->_vptr_CryptoFactory[2])(pCVar5,2);
  plVar6 = (long *)CONCAT44(extraout_var,iVar3);
  if (plVar6 == (long *)0x0) {
    return 5;
  }
  cVar2 = (**(code **)(*plVar6 + 0x78))(plVar6,&p,uVar11,0);
  if (cVar2 == '\0') {
    softHSMLog(3,"generateDSAParameters",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x2324,"Could not generate parameters");
    pCVar5 = CryptoFactory::i();
    (*pCVar5->_vptr_CryptoFactory[3])(pCVar5,plVar6);
    return 5;
  }
  local_478 = (DSAParameters *)p;
  objClass = 6;
  keyType = 1;
  local_470 = plVar6;
  memset(paramsAttribs,0,0x300);
  paramsAttribs[0].pValue = &objClass;
  paramsAttribs[0].ulValueLen = 8;
  paramsAttribs[1].type = 1;
  paramsAttribs[1].pValue = &isOnToken_local;
  paramsAttribs[1].ulValueLen = 1;
  paramsAttribs[2].type = 2;
  paramsAttribs[2].pValue = &isPrivate;
  paramsAttribs[2].ulValueLen = 1;
  paramsAttribs[3].type = 0x100;
  paramsAttribs[3].pValue = &keyType;
  paramsAttribs[3].ulValueLen = 8;
  CVar10 = 4;
  for (uVar11 = 0; (ulCount < 0x1d && (uVar11 < ulCount)); uVar11 = uVar11 + 1) {
    CVar9 = CVar10;
    if ((2 < pTemplate->type) && (pTemplate->type != 0x100)) {
      CVar9 = CVar10 + 1;
      paramsAttribs[CVar10].ulValueLen = pTemplate->ulValueLen;
      pvVar1 = pTemplate->pValue;
      paramsAttribs[CVar10].type = pTemplate->type;
      paramsAttribs[CVar10].pValue = pvVar1;
    }
    pTemplate = pTemplate + 1;
    CVar10 = CVar9;
  }
  CStack_4a0 = 0xd1;
  if ((0x1c < ulCount) ||
     (CStack_4a0 = CreateObject(this,hSession,paramsAttribs,CVar10,local_488,4), CStack_4a0 != 0))
  goto LAB_00138bab;
  plVar6 = (long *)HandleManager::getObject(this->handleManager,*local_488);
  CStack_4a0 = 6;
  if ((plVar6 == (long *)0x0) ||
     ((cVar2 = (**(code **)(*plVar6 + 0x50))(plVar6), CStack_4a0 = 6, cVar2 == '\0' ||
      (cVar2 = (**(code **)(*plVar6 + 0x58))(plVar6,1), cVar2 == '\0')))) goto LAB_00138bab;
  OSAttribute::OSAttribute(&local_3d8,true);
  cVar2 = (**(code **)(*plVar6 + 0x40))(plVar6,0x163,&local_3d8);
  OSAttribute::~OSAttribute(&local_3d8);
  this_01 = local_468;
  this_00 = local_478;
  if (cVar2 == '\0') {
    cVar2 = '\0';
  }
  else {
    OSAttribute::OSAttribute(&local_3d8,0x2000);
    cVar2 = (**(code **)(*plVar6 + 0x40))(plVar6,0x166,&local_3d8);
    OSAttribute::~OSAttribute(&local_3d8);
  }
  ByteString::ByteString(&prime);
  ByteString::ByteString(&subprime);
  ByteString::ByteString(&generator);
  if (isPrivate == '\0') {
    pBVar7 = DSAParameters::getP(this_00);
    ByteString::operator=(&prime,pBVar7);
    pBVar7 = DSAParameters::getQ(this_00);
    ByteString::operator=(&subprime,pBVar7);
    pBVar7 = DSAParameters::getG(this_00);
    ByteString::operator=(&generator,pBVar7);
  }
  else {
    pBVar7 = DSAParameters::getP(this_00);
    Token::encrypt(this_01,(char *)pBVar7,(int)&prime);
    pBVar7 = DSAParameters::getQ(this_00);
    Token::encrypt(this_01,(char *)pBVar7,(int)&subprime);
    pBVar7 = DSAParameters::getG(this_00);
    Token::encrypt(this_01,(char *)pBVar7,(int)&generator);
  }
  if (cVar2 == '\0') {
LAB_00138e72:
    (**(code **)(*plVar6 + 0x68))(plVar6);
    cVar2 = '\0';
  }
  else {
    OSAttribute::OSAttribute(&local_3d8,&prime);
    cVar2 = (**(code **)(*plVar6 + 0x40))(plVar6,0x130,&local_3d8);
    OSAttribute::~OSAttribute(&local_3d8);
    if (cVar2 == '\0') goto LAB_00138e72;
    OSAttribute::OSAttribute(&local_3d8,&subprime);
    cVar2 = (**(code **)(*plVar6 + 0x40))(plVar6,0x131,&local_3d8);
    OSAttribute::~OSAttribute(&local_3d8);
    if (cVar2 == '\0') goto LAB_00138e72;
    OSAttribute::OSAttribute(&local_3d8,&generator);
    cVar2 = (**(code **)(*plVar6 + 0x40))(plVar6,0x132,&local_3d8);
    OSAttribute::~OSAttribute(&local_3d8);
    if (cVar2 == '\0') goto LAB_00138e72;
    cVar2 = (**(code **)(*plVar6 + 0x60))(plVar6);
  }
  ByteString::~ByteString(&generator);
  ByteString::~ByteString(&subprime);
  ByteString::~ByteString(&prime);
  CStack_4a0 = 6;
  if (cVar2 != '\0') {
    CStack_4a0 = 0;
  }
LAB_00138bab:
  plVar6 = local_470;
  (**(code **)(*local_470 + 200))(local_470,p);
  pCVar5 = CryptoFactory::i();
  (*pCVar5->_vptr_CryptoFactory[3])(pCVar5,plVar6);
  if ((CStack_4a0 != 0) && (*local_488 != 0)) {
    plVar6 = (long *)HandleManager::getObject(this->handleManager,*local_488);
    HandleManager::destroyObject(this->handleManager,*local_488);
    if (plVar6 != (long *)0x0) {
      (**(code **)(*plVar6 + 0x70))(plVar6);
    }
    *local_488 = 0;
  }
  return CStack_4a0;
}

Assistant:

CK_RV SoftHSM::generateDSAParameters
(CK_SESSION_HANDLE hSession,
	CK_ATTRIBUTE_PTR pTemplate,
	CK_ULONG ulCount,
	CK_OBJECT_HANDLE_PTR phKey,
	CK_BBOOL isOnToken,
	CK_BBOOL isPrivate)
{
	*phKey = CK_INVALID_HANDLE;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL)
		return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL)
		return CKR_GENERAL_ERROR;

	// Extract desired parameter information
	size_t bitLen = 0;
	size_t qLen = 0;
	for (CK_ULONG i = 0; i < ulCount; i++)
	{
		switch (pTemplate[i].type)
		{
			case CKA_PRIME_BITS:
				if (pTemplate[i].ulValueLen != sizeof(CK_ULONG))
				{
					INFO_MSG("CKA_PRIME_BITS does not have the size of CK_ULONG");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				bitLen = *(CK_ULONG*)pTemplate[i].pValue;
				break;
			case CKA_SUB_PRIME_BITS:
				if (pTemplate[i].ulValueLen != sizeof(CK_ULONG))
				{
					INFO_MSG("CKA_SUB_PRIME_BITS does not have the size of CK_ULONG");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				qLen = *(CK_ULONG*)pTemplate[i].pValue;
				break;
			default:
				break;
		}
	}

	// CKA_PRIME_BITS must be specified
	if (bitLen == 0)
	{
		INFO_MSG("Missing CKA_PRIME_BITS in pTemplate");
		return CKR_TEMPLATE_INCOMPLETE;
	}

	// No real choice for CKA_SUB_PRIME_BITS
	if ((qLen != 0) &&
	    (((bitLen >= 2048) && (qLen != 256)) ||
	     ((bitLen < 2048) && (qLen != 160))))
		INFO_MSG("CKA_SUB_PRIME_BITS is ignored");


	// Generate domain parameters
	AsymmetricParameters* p = NULL;
	AsymmetricAlgorithm* dsa = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::DSA);
	if (dsa == NULL) return CKR_GENERAL_ERROR;
	if (!dsa->generateParameters(&p, (void *)bitLen))
	{
		ERROR_MSG("Could not generate parameters");
		CryptoFactory::i()->recycleAsymmetricAlgorithm(dsa);
		return CKR_GENERAL_ERROR;
	}

	DSAParameters* params = (DSAParameters*) p;

	CK_RV rv = CKR_OK;

	// Create the domain parameter object using C_CreateObject
	const CK_ULONG maxAttribs = 32;
	CK_OBJECT_CLASS objClass = CKO_DOMAIN_PARAMETERS;
	CK_KEY_TYPE keyType = CKK_DSA;
	CK_ATTRIBUTE paramsAttribs[maxAttribs] = {
		{ CKA_CLASS, &objClass, sizeof(objClass) },
		{ CKA_TOKEN, &isOnToken, sizeof(isOnToken) },
		{ CKA_PRIVATE, &isPrivate, sizeof(isPrivate) },
		{ CKA_KEY_TYPE, &keyType, sizeof(keyType) },
	};
	CK_ULONG paramsAttribsCount = 4;

	// Add the additional
	if (ulCount > (maxAttribs - paramsAttribsCount))
		rv = CKR_TEMPLATE_INCONSISTENT;
	for (CK_ULONG i=0; i < ulCount && rv == CKR_OK; ++i)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CLASS:
			case CKA_TOKEN:
			case CKA_PRIVATE:
			case CKA_KEY_TYPE:
				continue;
		default:
			paramsAttribs[paramsAttribsCount++] = pTemplate[i];
		}
	}

	if (rv == CKR_OK)
		rv = this->CreateObject(hSession, paramsAttribs, paramsAttribsCount, phKey,OBJECT_OP_GENERATE);

	// Store the attributes that are being supplied
	if (rv == CKR_OK)
	{
		OSObject* osobject = (OSObject*)handleManager->getObject(*phKey);
		if (osobject == NULL_PTR || !osobject->isValid()) {
			rv = CKR_FUNCTION_FAILED;
		} else if (osobject->startTransaction()) {
			bool bOK = true;

			// Common Attributes
			bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
			CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_DSA_PARAMETER_GEN;
			bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

			// DSA Domain Parameters Attributes
			ByteString prime;
			ByteString subprime;
			ByteString generator;
			if (isPrivate)
			{
				token->encrypt(params->getP(), prime);
				token->encrypt(params->getQ(), subprime);
				token->encrypt(params->getG(), generator);
			}
			else
			{
				prime = params->getP();
				subprime = params->getQ();
				generator = params->getG();
			}
			bOK = bOK && osobject->setAttribute(CKA_PRIME, prime);
			bOK = bOK && osobject->setAttribute(CKA_SUBPRIME, subprime);
			bOK = bOK && osobject->setAttribute(CKA_BASE, generator);

			if (bOK)
				bOK = osobject->commitTransaction();
			else
				osobject->abortTransaction();

			if (!bOK)
				rv = CKR_FUNCTION_FAILED;
		} else
			rv = CKR_FUNCTION_FAILED;
	}

	// Clean up
	dsa->recycleParameters(p);
	CryptoFactory::i()->recycleAsymmetricAlgorithm(dsa);

	// Remove parameters that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*phKey != CK_INVALID_HANDLE)
		{
			OSObject* osparams = (OSObject*)handleManager->getObject(*phKey);
			handleManager->destroyObject(*phKey);
			if (osparams) osparams->destroyObject();
			*phKey = CK_INVALID_HANDLE;
		}
	}

	return rv;
}